

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_timeout.cc
# Opt level: O0

void __thiscall
absl::lts_20240722::synchronization_internal::KernelTimeout::KernelTimeout
          (KernelTimeout *this,Time t)

{
  bool bVar1;
  Time rhs;
  long local_88;
  int64_t unix_nanos;
  KernelTimeout *this_local;
  Time t_local;
  
  rhs = InfiniteFuture();
  bVar1 = operator==(t,rhs);
  if (bVar1) {
    this->rep_ = 0xffffffffffffffff;
  }
  else {
    local_88 = absl::lts_20240722::ToUnixNanos(t);
    if (local_88 < 0) {
      local_88 = 0;
    }
    if (local_88 < 0x7fffffffffffffff) {
      this->rep_ = local_88 << 1;
    }
    else {
      this->rep_ = 0xffffffffffffffff;
    }
  }
  return;
}

Assistant:

KernelTimeout::KernelTimeout(absl::Time t) {
  // `absl::InfiniteFuture()` is a common "no timeout" value and cheaper to
  // compare than convert.
  if (t == absl::InfiniteFuture()) {
    rep_ = kNoTimeout;
    return;
  }

  int64_t unix_nanos = absl::ToUnixNanos(t);

  // A timeout that lands before the unix epoch is converted to 0.
  // In theory implementations should expire these timeouts immediately.
  if (unix_nanos < 0) {
    unix_nanos = 0;
  }

  // Values greater than or equal to kMaxNanos are converted to infinite.
  if (unix_nanos >= kMaxNanos) {
    rep_ = kNoTimeout;
    return;
  }

  rep_ = static_cast<uint64_t>(unix_nanos) << 1;
}